

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O3

void envydis(disisa *isa,FILE *out,uint8_t *code,uint32_t start,int num,varinfo *varinfo,int quiet,
            label *labels,int labelsnum,envy_colors *cols)

{
  char **ppcVar1;
  char **ppcVar2;
  char **ppcVar3;
  label *plVar4;
  ull *puVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint32_t uVar17;
  dis_status dVar18;
  int *__ptr;
  char **__ptr_00;
  dis_res *pdVar19;
  envy_colors *peVar20;
  char **ppcVar21;
  uint32_t uVar22;
  int iVar23;
  long lVar24;
  uint32_t uVar25;
  char *pcVar26;
  char *__format;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  byte *pbVar31;
  uint uVar32;
  decoctx local_70;
  
  local_70.labelsnum = 0;
  local_70.labelsmax = 0;
  local_70.code = code;
  local_70.codesz = num;
  __ptr = (int *)calloc((long)num,4);
  local_70.marks = __ptr;
  __ptr_00 = (char **)calloc((long)num,8);
  local_70.labels = labels;
  local_70.labelsnum = labelsnum;
  local_70.isa = isa;
  local_70.varinfo = varinfo;
  local_70.names = __ptr_00;
  local_70.codebase = start;
  uVar12 = ed_getcbsz(isa,varinfo);
  uVar13 = ed_getcbsz(isa,varinfo);
  if (labels == (label *)0x0) {
    if (num < 1) goto LAB_0026af62;
    uVar25 = 0;
    do {
      pdVar19 = do_dis(&local_70,uVar25);
      dis_dopp(&local_70,pdVar19,(ulong)(uVar25 + start));
      uVar25 = uVar25 + pdVar19->oplen + (uint)(pdVar19->oplen == 0);
      easm_del_insn(pdVar19->insn);
      free(pdVar19);
    } while ((int)uVar25 < num);
  }
  else {
    if (0 < labelsnum) {
      uVar14 = num + start;
      uVar27 = 0;
      do {
        plVar4 = labels + uVar27;
        uVar28 = plVar4->val;
        uVar30 = (uint)uVar28;
        if (uVar30 < uVar14 && start <= uVar30) {
          __ptr[uVar30 - start] = __ptr[uVar30 - start] | plVar4->type;
        }
        if ((uVar28 < uVar14 && start <= uVar28) && (plVar4->name != (char *)0x0)) {
          __ptr_00[uVar28 - start] = plVar4->name;
        }
        uVar30 = plVar4->size;
        if ((ulong)uVar30 != 0) {
          uVar29 = 0;
          do {
            uVar15 = (uint)uVar28;
            if (uVar15 < uVar14 && start <= uVar15) {
              __ptr[uVar15 - start] = __ptr[uVar15 - start] | plVar4->type;
            }
            uVar29 = uVar29 + 4;
            uVar28 = (ulong)(uVar15 + 4);
          } while (uVar29 < uVar30);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != (uint)labelsnum);
    }
    do {
      if (num < 1) goto LAB_0026af62;
      bVar8 = true;
      uVar25 = 0;
      uVar14 = 0;
      do {
        if (uVar14 == 0) {
          uVar14 = __ptr[(int)uVar25];
          if ((char)((uVar14 & 8) >> 3) == '\0' && (uVar14 & 3) != 0) {
            __ptr[(int)uVar25] = uVar14 | 8;
            bVar8 = false;
            goto LAB_0026a4dc;
          }
          uVar25 = uVar25 + 1;
          uVar14 = 0;
        }
        else {
LAB_0026a4dc:
          pdVar19 = do_dis(&local_70,uVar25);
          dis_dopp(&local_70,pdVar19,(ulong)(start + uVar25));
          uVar14 = 0;
          if ((pdVar19->oplen != 0) && (uVar14 = 0, pdVar19->endmark == 0)) {
            uVar14 = (__ptr[(int)uVar25] & 4U) >> 2 ^ 1;
            uVar17 = 0;
            if ((__ptr[(int)uVar25] & 4U) == 0) {
              uVar17 = pdVar19->oplen;
            }
            uVar25 = uVar17 + uVar25;
          }
          easm_del_insn(pdVar19->insn);
          free(pdVar19);
        }
      } while ((int)uVar25 < num);
    } while (!bVar8);
  }
  if (0 < num) {
    uVar14 = uVar12 + 7 >> 3;
    ppcVar1 = &cols->ctarg;
    ppcVar2 = &cols->btarg;
    ppcVar3 = &cols->err;
    uVar25 = 0;
    bVar7 = false;
    bVar8 = false;
    iVar23 = 0;
    bVar9 = false;
LAB_0026a652:
    uVar30 = __ptr[(int)uVar25];
    if (__ptr_00[(int)uVar25] == (char *)0x0) {
      if ((bVar9) || ((uVar30 & 0x1b0) == 0)) {
        bVar10 = !bVar9;
        bVar9 = true;
        if (bVar10) goto LAB_0026a94c;
LAB_0026a97b:
        if (iVar23 != 0) {
          pcVar26 = "%s[%x bytes skipped]\n";
          peVar20 = (envy_colors *)ppcVar3;
          if (!bVar8) {
            pcVar26 = "%s[%x zero bytes skipped]\n";
            peVar20 = cols;
          }
          bVar8 = false;
          fprintf((FILE *)out,pcVar26,peVar20->reset);
        }
        goto LAB_0026a9bb;
      }
      if (iVar23 != 0) {
        pcVar26 = "%s[%x bytes skipped]\n";
        peVar20 = (envy_colors *)ppcVar3;
        if (!bVar8) {
          pcVar26 = "%s[%x zero bytes skipped]\n";
          peVar20 = cols;
        }
        bVar8 = false;
        fprintf((FILE *)out,pcVar26,peVar20->reset);
      }
LAB_0026a7ad:
      if (uVar13 != 8) {
        abort();
      }
      fprintf((FILE *)out,"%s%08x:%s",cols->mem,(ulong)(start + uVar25),cols->reset);
      if ((char)uVar30 < '\0') {
        fprintf((FILE *)out," %s%02x\n",cols->num);
        uVar25 = uVar25 + 1;
      }
      else if ((uVar30 >> 8 & 1) == 0) {
        if ((uVar30 & 0x10) == 0) {
          fprintf((FILE *)out," %s\"",cols->num);
          pbVar31 = code + (int)uVar25;
          do {
            uVar25 = uVar25 + 1;
            bVar6 = *pbVar31;
            uVar30 = (uint)bVar6;
            if (bVar6 < 0x22) {
              if (bVar6 == 10) {
                pcVar26 = "\\n";
                goto LAB_0026a877;
              }
              if (uVar30 == 0) goto LAB_0026aef5;
LAB_0026a889:
              fputc(uVar30,(FILE *)out);
            }
            else {
              if (uVar30 == 0x22) {
                pcVar26 = "\\\"";
              }
              else {
                if (uVar30 != 0x5c) goto LAB_0026a889;
                pcVar26 = "\\\\";
              }
LAB_0026a877:
              fwrite(pcVar26,2,1,(FILE *)out);
            }
            pbVar31 = pbVar31 + 1;
          } while( true );
        }
        uVar17 = num;
        if (num < (int)uVar25) {
          uVar17 = uVar25;
        }
        lVar24 = 0;
        do {
          if ((ulong)(uVar17 - uVar25) << 3 == lVar24) break;
          lVar24 = lVar24 + 8;
        } while (lVar24 != 0x20);
        fprintf((FILE *)out," %s%08x\n",cols->num);
        uVar25 = uVar25 + 4;
      }
      else {
        fprintf((FILE *)out," %s%04x\n",cols->num);
        uVar25 = uVar25 + 2;
      }
      goto LAB_0026af16;
    }
    if (iVar23 != 0) {
      pcVar26 = "%s[%x bytes skipped]\n";
      peVar20 = (envy_colors *)ppcVar3;
      if (!bVar8) {
        pcVar26 = "%s[%x zero bytes skipped]\n";
        peVar20 = cols;
      }
      bVar8 = false;
      fprintf((FILE *)out,pcVar26,peVar20->reset);
    }
    if ((uVar30 & 0x1b0) != 0) {
      fprintf((FILE *)out,"%s%s:\n",cols->reset,__ptr_00[(int)uVar25]);
      bVar7 = !bVar9;
      bVar9 = true;
      if (bVar7) goto LAB_0026a7ad;
LAB_0026a9bb:
      pdVar19 = do_dis(&local_70,uVar25);
      uVar27 = (ulong)(uVar25 + start);
      dis_dopp(&local_70,pdVar19,uVar27);
      if ((uVar30 & 4) != 0 || pdVar19->endmark != 0) {
        bVar9 = false;
      }
      if (((uVar30 & 2) != 0) && (__ptr_00[(int)uVar25] == (char *)0x0)) {
        fputc(10,(FILE *)out);
      }
      ppcVar21 = ppcVar2;
      switch(uVar30 & 3) {
      case 0:
        if (quiet != 0) goto LAB_0026aab1;
        fprintf((FILE *)out,"%s%08x:%s",cols->reset,uVar27,cols->reset);
        goto LAB_0026aad5;
      case 2:
        ppcVar21 = ppcVar1;
        break;
      case 3:
        ppcVar21 = &cols->bctarg;
      }
      fprintf((FILE *)out,"%s%08x:%s",*ppcVar21,uVar27,cols->reset);
      if (quiet == 0) {
LAB_0026aad5:
        if (0 < isa->maxoplen) {
          iVar23 = 0;
          do {
            fputc(0x20,(FILE *)out);
            iVar16 = isa->opunit;
            if (0 < (int)(iVar16 * uVar14)) {
              uVar27 = (ulong)(iVar16 * uVar14);
              do {
                iVar16 = (int)((uVar27 - 1 & 0xffffffff) / (ulong)uVar14);
                uVar15 = iVar16 + iVar23;
                if ((uVar15 == 0) || (uVar15 < pdVar19->oplen)) {
                  if ((int)(iVar16 + uVar25 + iVar23) < num) {
                    fprintf((FILE *)out,"%s%02x",cols->reset,
                            (ulong)code[uVar27 + (long)(int)((uVar25 + iVar23) * uVar14) + -1]);
                  }
                  else {
                    fprintf((FILE *)out,"%s??",cols->err);
                  }
                }
                else {
                  fwrite("  ",2,1,(FILE *)out);
                }
                bVar7 = 1 < uVar27;
                uVar27 = uVar27 - 1;
              } while (bVar7);
              iVar16 = isa->opunit;
            }
            iVar23 = iVar23 + iVar16;
          } while (iVar23 < isa->maxoplen);
        }
        fwrite("  ",2,1,(FILE *)out);
        if ((uVar30 & 2) == 0) {
          fputc(0x20,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"%sC",*ppcVar1);
        }
        if ((uVar30 & 1) == 0) {
          iVar23 = 0x20;
          fputc(0x20,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"%sB",*ppcVar2);
          iVar23 = 0x20;
        }
LAB_0026ac4a:
        fputc(iVar23,(FILE *)out);
      }
      else {
LAB_0026aab1:
        if ((quiet == 1) && (iVar23 = 10, uVar30 != 0)) goto LAB_0026ac4a;
      }
      easm_print_insn(out,cols,pdVar19->insn);
      if ((pdVar19->status & DIS_STATUS_UNK_FORM) == DIS_STATUS_OK) {
        uVar17 = pdVar19->oplen;
        if ((int)uVar17 < 0x10) {
          iVar23 = uVar17 * 8;
          do {
            uVar22 = uVar17 + 7;
            if (-1 < (int)uVar17) {
              uVar22 = uVar17;
            }
            pdVar19->a[(int)uVar22 >> 3] =
                 pdVar19->a[(int)uVar22 >> 3] & ~(0xffL << ((byte)iVar23 & 0x38));
            uVar17 = uVar17 + 1;
            iVar23 = iVar23 + 8;
          } while (uVar17 != 0x10);
        }
        lVar24 = 0;
        bVar7 = false;
        bVar10 = true;
        do {
          bVar11 = bVar10;
          puVar5 = pdVar19->a + lVar24;
          *puVar5 = *puVar5 & ~pdVar19->m[lVar24];
          if (*puVar5 != 0) {
            bVar7 = true;
          }
          lVar24 = 1;
          bVar10 = false;
        } while (bVar11);
        if (bVar7) {
          uVar30 = 0;
          fprintf((FILE *)out," %s[unknown:",cols->err);
          do {
            fputc(0x20,(FILE *)out);
            iVar23 = isa->opunit;
            uVar15 = iVar23 * uVar14;
            if (0 < (int)uVar15) {
              iVar23 = (uVar15 + uVar30 + -1) * 8;
              do {
                uVar32 = uVar15 - 1;
                if ((int)(uVar25 + uVar30 + uVar32) < num) {
                  iVar16 = uVar30 + 7 + uVar32;
                  if (-1 < (int)(uVar30 + uVar32)) {
                    iVar16 = uVar30 + uVar32;
                  }
                  fprintf((FILE *)out,"%02llx",
                          pdVar19->a[iVar16 >> 3] >> ((byte)iVar23 & 0x38) & 0xff);
                }
                else {
                  fwrite("??",2,1,(FILE *)out);
                }
                iVar23 = iVar23 + -8;
                bVar7 = 1 < uVar15;
                uVar15 = uVar32;
              } while (bVar7);
              iVar23 = isa->opunit;
            }
            uVar30 = uVar30 + iVar23;
          } while ((uVar30 == 0) || (uVar30 < pdVar19->oplen));
          fputc(0x5d,(FILE *)out);
        }
      }
      else {
        fprintf((FILE *)out," %s[unknown op length]%s",cols->err);
      }
      dVar18 = pdVar19->status;
      if ((dVar18 & DIS_STATUS_EOF) != DIS_STATUS_OK) {
        fprintf((FILE *)out," %s[incomplete]%s",cols->err);
        dVar18 = pdVar19->status;
      }
      if ((dVar18 & DIS_STATUS_UNK_INSN) != DIS_STATUS_OK) {
        fprintf((FILE *)out," %s[unknown instruction]%s",cols->err);
        dVar18 = pdVar19->status;
      }
      if ((dVar18 & DIS_STATUS_UNK_OPERAND) != DIS_STATUS_OK) {
        fprintf((FILE *)out," %s[unknown operand]%s",cols->err);
      }
      fprintf((FILE *)out,"%s\n",cols->reset);
      uVar25 = uVar25 + pdVar19->oplen;
      easm_del_insn(pdVar19->insn);
      free(pdVar19);
      goto LAB_0026af1d;
    }
    if ((uVar30 & 2) == 0) {
      peVar20 = (envy_colors *)ppcVar2;
      if ((uVar30 & 1) == 0) {
        peVar20 = cols;
      }
      pcVar26 = peVar20->reset;
      __format = "%s%s:\n";
    }
    else {
      pcVar26 = *ppcVar1;
      __format = "\n%s%s:\n";
    }
    fprintf((FILE *)out,__format,pcVar26);
    if (bVar9) {
      bVar9 = true;
      goto LAB_0026a9bb;
    }
    iVar23 = 0;
    bVar7 = bVar8;
LAB_0026a94c:
    uVar15 = uVar30 & 7;
    bVar9 = uVar15 != 0;
    if ((labels == (label *)0x0) || (uVar15 != 0)) goto LAB_0026a97b;
    if (7 < uVar12 + 7) {
      uVar27 = 0;
      do {
        if (code[uVar27 + (long)(int)(uVar25 * uVar14)] != '\0') {
          bVar7 = true;
        }
        uVar27 = uVar27 + 1;
        bVar8 = bVar7;
      } while (uVar14 != uVar27);
    }
    uVar25 = uVar25 + 1;
    iVar23 = iVar23 + 1;
    bVar9 = false;
    goto LAB_0026af21;
  }
LAB_0026af62:
  free(__ptr);
  free(__ptr_00);
  return;
LAB_0026aef5:
  fwrite("\"\n",2,1,(FILE *)out);
LAB_0026af16:
  bVar9 = false;
LAB_0026af1d:
  iVar23 = 0;
  bVar7 = bVar8;
LAB_0026af21:
  if (num <= (int)uVar25) goto LAB_0026af62;
  goto LAB_0026a652;
}

Assistant:

void envydis (const struct disisa *isa, FILE *out, uint8_t *code, uint32_t start, int num, struct varinfo *varinfo, int quiet, struct label *labels, int labelsnum, const struct envy_colors *cols)
{
	struct decoctx c = { 0 };
	struct decoctx *ctx = &c;
	int cur = 0, i, j;
	ctx->code = code;
	ctx->codesz = num;
	ctx->marks = calloc(num, sizeof *ctx->marks);
	ctx->names = calloc(num, sizeof *ctx->names);
	ctx->codebase = start;
	ctx->varinfo = varinfo;
	ctx->isa = isa;
	ctx->labels = labels;
	ctx->labelsnum = labelsnum;
	int stride = ed_getcstride(ctx->isa, ctx->varinfo);
	int cbsz = ed_getcbsz(ctx->isa, ctx->varinfo);
	if (labels) {
		for (i = 0; i < labelsnum; i++) {
			mark(ctx, labels[i].val, labels[i].type);
			if (labels[i].val >= ctx->codebase && labels[i].val < ctx->codebase + ctx->codesz) {
				if (labels[i].name)
					ctx->names[labels[i].val - ctx->codebase] = labels[i].name;
			}
			if (labels[i].size) {
				for (j = 0; j < labels[i].size; j+=4)
					mark(ctx, labels[i].val + j, labels[i].type);
			}
		}
		int done;
		do {
			done = 1;
			cur = 0;
			int active = 0;
			while (cur < num) {
				if (!active && (ctx->marks[cur] & 3) && !(ctx->marks[cur] & 8)) {
					done = 0;
					active = 1;
					ctx->marks[cur] |= 8;
				}
				if (active) {
					struct dis_res *dres = do_dis(ctx, cur);
					dis_dopp(ctx, dres, cur + start);
					if (dres->oplen && !dres->endmark && !(ctx->marks[cur] & 4))
						cur += dres->oplen;
					else
						active = 0;
					dis_del_res(dres);
				} else {
					cur++;
				}
			}
		} while (!done);
	} else {
		while (cur < num) {
			struct dis_res *dres = do_dis(ctx, cur);
			dis_dopp(ctx, dres, cur + start);
			if (dres->oplen)
				cur += dres->oplen;
			else
				cur++;
			dis_del_res(dres);
		}
	}
	cur = 0;
	int active = 0;
	int skip = 0, nonzero = 0;
	while (cur < num) {
		int mark = ctx->marks[cur];
		if (ctx->names[cur]) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (mark & 0x1b0)
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
			else if (mark & 2)
				fprintf (out, "\n%s%s:\n", cols->ctarg, ctx->names[cur]);
			else if (mark & 1)
				fprintf (out, "%s%s:\n", cols->btarg, ctx->names[cur]);
			else
				fprintf (out, "%s%s:\n", cols->reset, ctx->names[cur]);
		}
		if (mark & 0x1b0 && !active) {
			if (skip) {
				if (nonzero)
					fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
				else
					fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
				skip = 0;
				nonzero = 0;
			}
			if (cbsz != 8)
				abort();
			fprintf (out, "%s%08x:%s", cols->mem, cur + start, cols->reset);
			if (mark & 0x80) {
				uint8_t val = code[cur];
				fprintf (out, " %s%02x\n", cols->num, val);
				cur += 1;
			} else if (mark & 0x100) {
				uint16_t val = 0;
				for (i = 0; i < 2 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%04x\n", cols->num, val);
				cur += 2;
			} else if (mark & 0x10) {
				uint32_t val = 0;
				for (i = 0; i < 4 && cur + i < num; i++) {
					val |= code[cur + i] << i*8;
				}
				fprintf (out, " %s%08x\n", cols->num, val);
				cur += 4;
			} else {
				fprintf (out, " %s\"", cols->num);
				while (code[cur]) {
					switch (code[cur]) {
						case '\n':
							fprintf (out, "\\n");
							break;
						case '\\':
							fprintf (out, "\\\\");
							break;
						case '\"':
							fprintf (out, "\\\"");
							break;
						default:
							fprintf (out, "%c", code[cur]);
							break;
					}
					cur++;
				}
				cur++;
				fprintf (out, "\"\n");
			}
			continue;
		}
		if (!active && mark & 7)
			active = 1;
		if (!active && labels) {
			for (i = 0; i < stride; i++)
				if (code[cur*stride+i])
					nonzero = 1;
			cur++;
			skip++;
			continue;
		}
		if (skip) {
			if (nonzero)
				fprintf(out, "%s[%x bytes skipped]\n", cols->err, skip);
			else
				fprintf(out, "%s[%x zero bytes skipped]\n", cols->reset, skip);
			skip = 0;
			nonzero = 0;
		}
		struct dis_res *dres = do_dis(ctx, cur);
		dis_dopp(ctx, dres, cur + start);

		if (dres->endmark || mark & 4)
			active = 0;

		if (mark & 2 && !ctx->names[cur])
			fprintf (out, "\n");
		switch (mark & 3) {
			case 0:
				if (!quiet)
					fprintf (out, "%s%08x:%s", cols->reset, cur + start, cols->reset);
				break;
			case 1:
				fprintf (out, "%s%08x:%s", cols->btarg, cur + start, cols->reset);
				break;
			case 2:
				fprintf (out, "%s%08x:%s", cols->ctarg, cur + start, cols->reset);
				break;
			case 3:
				fprintf (out, "%s%08x:%s", cols->bctarg, cur + start, cols->reset);
				break;
		}

		if (!quiet) {
			for (i = 0; i < isa->maxoplen; i += isa->opunit) {
				fprintf (out, " ");
				for (j = isa->opunit*stride - 1; j >= 0; j--)
					if (i+j/stride && i+j/stride >= dres->oplen) {
						fprintf (out, "  ");
					} else if (cur+i+j/stride >= num) {
						fprintf (out, "%s??", cols->err);
					} else {
						fprintf (out, "%s%02x", cols->reset, code[(cur + i)*stride + j]);
					}
			}
			fprintf (out, "  ");

			if (mark & 2)
				fprintf (out, "%sC", cols->ctarg);
			else
				fprintf (out, " ");
			if (mark & 1)
				fprintf (out, "%sB", cols->btarg);
			else
				fprintf (out, " ");
			fprintf(out, " ");
		} else if (quiet == 1) {
			if (mark)
				fprintf (out, "\n");
		}

		easm_print_insn(out, cols, dres->insn);

		if (dres->status & DIS_STATUS_UNK_FORM) {
			fprintf (out, " %s[unknown op length]%s", cols->err, cols->reset);
		} else {
			int fl = 0;
			for (i = dres->oplen; i < MAXOPLEN * 8; i++)
				dres->a[i/8] &= ~(0xffull << (i & 7) * 8);
			for (i = 0; i < MAXOPLEN; i++) {
				dres->a[i] &= ~dres->m[i];
				if (dres->a[i])
					fl = 1;
			}
			if (fl) {
				fprintf (out, " %s[unknown:", cols->err);
				for (i = 0; i < dres->oplen || i == 0; i += isa->opunit) {
					fprintf (out, " ");
					for (j = isa->opunit*stride - 1; j >= 0; j--)
						if (cur+i+j >= num)
							fprintf (out, "??");
						else
							fprintf (out, "%02llx", (dres->a[(i+j)/8] >> ((i + j)&7) * 8) & 0xff);
				}
				fprintf (out, "]");
			}
		}
		if (dres->status & DIS_STATUS_EOF) {
			fprintf (out, " %s[incomplete]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_INSN) {
			fprintf (out, " %s[unknown instruction]%s", cols->err, cols->reset);
		}
		if (dres->status & DIS_STATUS_UNK_OPERAND) {
			fprintf (out, " %s[unknown operand]%s", cols->err, cols->reset);
		}
		fprintf (out, "%s\n", cols->reset);
		cur += dres->oplen;

		dis_del_res(dres);
	}
	free(ctx->marks);
	free(ctx->names);
}